

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

bool __thiscall leveldb::anon_unknown_1::Limiter::Acquire(Limiter *this)

{
  int iVar1;
  long lVar2;
  int *in_RDI;
  long in_FS_OFFSET;
  int old_acquires_allowed;
  bool local_39;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  LOCK();
  iVar1 = *in_RDI;
  *in_RDI = *in_RDI + -1;
  UNLOCK();
  if (iVar1 < 1) {
    LOCK();
    *in_RDI = *in_RDI + 1;
    UNLOCK();
  }
  local_39 = iVar1 >= 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

bool Acquire() {
    int old_acquires_allowed =
        acquires_allowed_.fetch_sub(1, std::memory_order_relaxed);

    if (old_acquires_allowed > 0) return true;

    acquires_allowed_.fetch_add(1, std::memory_order_relaxed);
    return false;
  }